

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::MetafTime> *
metaf::MetafTime::fromStringDDHH(optional<metaf::MetafTime> *__return_storage_ptr__,string *s)

{
  _Optional_base<unsigned_int,_true,_true> _Var1;
  optional<unsigned_int> oVar2;
  
  if (s->_M_string_length == 4) {
    _Var1._M_payload.super__Optional_payload_base<unsigned_int> =
         (_Optional_payload<unsigned_int,_true,_true,_true>)strToUint(s,0,2);
    oVar2 = strToUint(s,2,2);
    if (((ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0 &&
        ((ulong)_Var1._M_payload.super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) {
      (__return_storage_ptr__->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
      super__Optional_base<unsigned_int,_true,_true>._M_payload =
           _Var1._M_payload.super__Optional_payload_base<unsigned_int>;
      (__return_storage_ptr__->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.hourValue =
           oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_payload;
      (__return_storage_ptr__->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.minuteValue = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_engaged = true;
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
  super__Optional_base<unsigned_int,_true,_true>._M_payload =
       (_Optional_payload<unsigned_int,_true,_true,_true>)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) = 0;
  *(undefined4 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_engaged = 0;
  return __return_storage_ptr__;
}

Assistant:

std::optional<MetafTime> MetafTime::fromStringDDHH(const std::string & s) {
	//static const std::regex rgx ("(\\d\\d)(\\d\\d)");
	static const std::optional<MetafTime> error;
	if (s.length() != 4) return error;
	const auto day = strToUint(s, 0, 2);
	const auto hour = strToUint(s, 2, 2);
	if (!day.has_value() || !hour.has_value()) return error;
	MetafTime metafTime;
	metafTime.dayValue = day;
	metafTime.hourValue = *hour;
	return metafTime;
}